

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_ver_2tap_half_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong stride;
  uint uVar7;
  undefined4 in_register_00000014;
  uint8_t *dst_00;
  uint8_t *extraout_RDX;
  undefined1 (*pauVar8) [32];
  long lVar9;
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [32];
  undefined1 auVar12 [32];
  __m128i d0;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  __m128i res;
  
  dst_00 = (uint8_t *)CONCAT44(in_register_00000014,h);
  if (w == 0x40) {
    auVar22 = *(undefined1 (*) [32])im_block;
    auVar23 = *(undefined1 (*) [32])(im_block + 0x10);
    auVar16 = *(undefined1 (*) [32])(im_block + 0x20);
    auVar21 = *(undefined1 (*) [32])(im_block + 0x30);
    pauVar11 = (undefined1 (*) [32])(im_block + 0xb0);
    pauVar8 = (undefined1 (*) [32])(dst + 0x20);
    auVar25._8_2_ = 0x10;
    auVar25._0_8_ = 0x10001000100010;
    auVar25._10_2_ = 0x10;
    auVar25._12_2_ = 0x10;
    auVar25._14_2_ = 0x10;
    auVar25._16_2_ = 0x10;
    auVar25._18_2_ = 0x10;
    auVar25._20_2_ = 0x10;
    auVar25._22_2_ = 0x10;
    auVar25._24_2_ = 0x10;
    auVar25._26_2_ = 0x10;
    auVar25._28_2_ = 0x10;
    auVar25._30_2_ = 0x10;
    do {
      auVar24 = vpaddw_avx2(auVar25,pauVar11[-7]);
      auVar22 = vpaddw_avx2(auVar24,auVar22);
      auVar14 = vpsraw_avx2(auVar22,5);
      auVar15 = vpaddw_avx2(auVar25,pauVar11[-6]);
      auVar22 = vpaddw_avx2(auVar15,auVar23);
      auVar22 = vpsraw_avx2(auVar22,5);
      auVar22 = vpackuswb_avx2(auVar14,auVar22);
      pauVar8[-1] = auVar22;
      auVar14 = vpaddw_avx2(auVar25,pauVar11[-5]);
      auVar16 = vpaddw_avx2(auVar14,auVar16);
      auVar12 = vpaddw_avx2(auVar25,pauVar11[-4]);
      auVar16 = vpsraw_avx2(auVar16,5);
      auVar21 = vpaddw_avx2(auVar12,auVar21);
      auVar21 = vpsraw_avx2(auVar21,5);
      auVar21 = vpackuswb_avx2(auVar16,auVar21);
      *pauVar8 = auVar21;
      auVar22 = pauVar11[-3];
      auVar23 = pauVar11[-2];
      auVar21 = vpaddw_avx2(auVar24,auVar22);
      auVar16 = vpsraw_avx2(auVar21,5);
      auVar21 = vpaddw_avx2(auVar15,auVar23);
      auVar21 = vpsraw_avx2(auVar21,5);
      auVar21 = vpackuswb_avx2(auVar16,auVar21);
      *(undefined1 (*) [32])(pauVar8[-1] + dst_stride) = auVar21;
      auVar16 = pauVar11[-1];
      auVar21 = *pauVar11;
      auVar24 = vpaddw_avx2(auVar14,auVar16);
      auVar15 = vpsraw_avx2(auVar24,5);
      auVar24 = vpaddw_avx2(auVar12,auVar21);
      auVar24 = vpsraw_avx2(auVar24,5);
      auVar24 = vpackuswb_avx2(auVar15,auVar24);
      *(undefined1 (*) [32])(*pauVar8 + dst_stride) = auVar24;
      pauVar11 = pauVar11 + 8;
      pauVar8 = (undefined1 (*) [32])(*pauVar8 + dst_stride * 2);
      uVar7 = (int)dst_00 - 2;
      dst_00 = (uint8_t *)(ulong)uVar7;
    } while (uVar7 != 0);
  }
  else if (w == 4) {
    auVar18 = ZEXT864(*(ulong *)im_block);
    stride = (ulong)(uint)(dst_stride * 2);
    lVar9 = 0;
    do {
      auVar13 = *(undefined1 (*) [16])(im_block + lVar9 * 4 + 4);
      auVar19 = vpunpcklqdq_avx(auVar18._0_16_,auVar13);
      auVar20 = vpsrldq_avx(auVar13,8);
      auVar13 = vpaddw_avx(auVar19,auVar13);
      auVar19._8_2_ = 0x10;
      auVar19._0_8_ = 0x10001000100010;
      auVar19._10_2_ = 0x10;
      auVar19._12_2_ = 0x10;
      auVar19._14_2_ = 0x10;
      auVar13 = vpaddw_avx(auVar13,auVar19);
      vpsraw_avx(auVar13,5);
      res[1] = (long)dst_stride;
      res[0] = (longlong)dst;
      pack_store_4x2_sse2(res,dst_00,stride);
      auVar18 = ZEXT1664(auVar20);
      dst = dst + dst_stride * 2;
      lVar9 = lVar9 + 2;
      dst_00 = extraout_RDX;
    } while (h != (int)lVar9);
  }
  else if (w == 8) {
    auVar13 = *(undefined1 (*) [16])im_block;
    pauVar10 = (undefined1 (*) [16])(im_block + 0x10);
    auVar21._8_2_ = 0x10;
    auVar21._0_8_ = 0x10001000100010;
    auVar21._10_2_ = 0x10;
    auVar21._12_2_ = 0x10;
    auVar21._14_2_ = 0x10;
    auVar21._16_2_ = 0x10;
    auVar21._18_2_ = 0x10;
    auVar21._20_2_ = 0x10;
    auVar21._22_2_ = 0x10;
    auVar21._24_2_ = 0x10;
    auVar21._26_2_ = 0x10;
    auVar21._28_2_ = 0x10;
    auVar21._30_2_ = 0x10;
    do {
      auVar16._0_16_ = ZEXT116(0) * pauVar10[-1] + ZEXT116(1) * auVar13;
      auVar16._16_16_ = ZEXT116(1) * pauVar10[-1];
      auVar13 = *pauVar10;
      auVar16 = vpaddw_avx2(auVar16,*(undefined1 (*) [32])(pauVar10 + -1));
      auVar16 = vpaddw_avx2(auVar16,auVar21);
      auVar16 = vpsraw_avx2(auVar16,5);
      auVar16 = vpackuswb_avx2(auVar16,ZEXT1632(auVar13));
      *(long *)dst = auVar16._0_8_;
      *(long *)(dst + dst_stride) = auVar16._16_8_;
      dst = dst + dst_stride * 2;
      pauVar10 = pauVar10 + 2;
      uVar7 = (int)dst_00 - 2;
      dst_00 = (uint8_t *)(ulong)uVar7;
    } while (uVar7 != 0);
  }
  else if (w == 0x10) {
    auVar21 = *(undefined1 (*) [32])im_block;
    pauVar8 = (undefined1 (*) [32])(im_block + 0x20);
    auVar22._8_2_ = 0x10;
    auVar22._0_8_ = 0x10001000100010;
    auVar22._10_2_ = 0x10;
    auVar22._12_2_ = 0x10;
    auVar22._14_2_ = 0x10;
    auVar22._16_2_ = 0x10;
    auVar22._18_2_ = 0x10;
    auVar22._20_2_ = 0x10;
    auVar22._22_2_ = 0x10;
    auVar22._24_2_ = 0x10;
    auVar22._26_2_ = 0x10;
    auVar22._28_2_ = 0x10;
    auVar22._30_2_ = 0x10;
    do {
      auVar16 = vpaddw_avx2(auVar22,pauVar8[-1]);
      auVar23 = vpaddw_avx2(auVar16,auVar21);
      auVar21 = *pauVar8;
      auVar23 = vpsraw_avx2(auVar23,5);
      auVar16 = vpaddw_avx2(auVar16,auVar21);
      auVar16 = vpsraw_avx2(auVar16,5);
      auVar16 = vpackuswb_avx2(auVar23,auVar16);
      auVar16 = vpermq_avx2(auVar16,0xd8);
      *(undefined1 (*) [16])dst = auVar16._0_16_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar16._16_16_;
      dst = *(undefined1 (*) [16])dst + dst_stride * 2;
      pauVar8 = pauVar8 + 2;
      uVar7 = (int)dst_00 - 2;
      dst_00 = (uint8_t *)(ulong)uVar7;
    } while (uVar7 != 0);
  }
  else if (w == 0x20) {
    auVar16 = *(undefined1 (*) [32])im_block;
    auVar21 = *(undefined1 (*) [32])(im_block + 0x10);
    pauVar8 = (undefined1 (*) [32])(im_block + 0x50);
    auVar23._8_2_ = 0x10;
    auVar23._0_8_ = 0x10001000100010;
    auVar23._10_2_ = 0x10;
    auVar23._12_2_ = 0x10;
    auVar23._14_2_ = 0x10;
    auVar23._16_2_ = 0x10;
    auVar23._18_2_ = 0x10;
    auVar23._20_2_ = 0x10;
    auVar23._22_2_ = 0x10;
    auVar23._24_2_ = 0x10;
    auVar23._26_2_ = 0x10;
    auVar23._28_2_ = 0x10;
    auVar23._30_2_ = 0x10;
    do {
      auVar22 = vpaddw_avx2(auVar23,pauVar8[-3]);
      auVar16 = vpaddw_avx2(auVar22,auVar16);
      auVar25 = vpaddw_avx2(auVar23,pauVar8[-2]);
      auVar16 = vpsraw_avx2(auVar16,5);
      auVar21 = vpaddw_avx2(auVar25,auVar21);
      auVar21 = vpsraw_avx2(auVar21,5);
      auVar21 = vpackuswb_avx2(auVar16,auVar21);
      *(undefined1 (*) [32])dst = auVar21;
      auVar16 = pauVar8[-1];
      auVar21 = *pauVar8;
      auVar22 = vpaddw_avx2(auVar22,auVar16);
      auVar24 = vpsraw_avx2(auVar22,5);
      auVar22 = vpaddw_avx2(auVar25,auVar21);
      auVar22 = vpsraw_avx2(auVar22,5);
      auVar22 = vpackuswb_avx2(auVar24,auVar22);
      *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar22;
      dst = *(undefined1 (*) [32])dst + dst_stride * 2;
      pauVar8 = pauVar8 + 4;
      uVar7 = (int)dst_00 - 2;
      dst_00 = (uint8_t *)(ulong)uVar7;
    } while (uVar7 != 0);
  }
  else if (w == 2) {
    uVar7 = *(uint *)im_block;
    lVar9 = 0;
    auVar13._8_2_ = 0x10;
    auVar13._0_8_ = 0x10001000100010;
    auVar13._10_2_ = 0x10;
    auVar13._12_2_ = 0x10;
    auVar13._14_2_ = 0x10;
    do {
      auVar19 = vpunpckldq_avx(ZEXT416(uVar7),ZEXT416(*(uint *)(im_block + lVar9 * 2 + 2)));
      uVar7 = *(uint *)(im_block + lVar9 * 2 + 4);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(im_block + lVar9 * 2 + 2);
      auVar19 = vpaddw_avx(auVar19,auVar20);
      auVar19 = vpaddw_avx(auVar19,auVar13);
      auVar19 = vpsraw_avx(auVar19,5);
      auVar19 = vpackuswb_avx(auVar19,auVar19);
      vpextrw_avx(auVar19,0);
      vpextrw_avx(auVar19,1);
      lVar9 = lVar9 + 2;
    } while (h != (int)lVar9);
  }
  else {
    auVar14 = *(undefined1 (*) [32])im_block;
    auVar21 = *(undefined1 (*) [32])(im_block + 0x10);
    auVar15 = *(undefined1 (*) [32])(im_block + 0x20);
    auVar16 = *(undefined1 (*) [32])(im_block + 0x30);
    auVar22 = *(undefined1 (*) [32])(im_block + 0x40);
    auVar23 = *(undefined1 (*) [32])(im_block + 0x50);
    auVar25 = *(undefined1 (*) [32])(im_block + 0x60);
    auVar24 = *(undefined1 (*) [32])(im_block + 0x70);
    lVar9 = (long)dst_stride;
    pauVar11 = (undefined1 (*) [32])(im_block + 0x170);
    pauVar8 = (undefined1 (*) [32])(dst + 0x60);
    auVar12._8_2_ = 0x10;
    auVar12._0_8_ = 0x10001000100010;
    auVar12._10_2_ = 0x10;
    auVar12._12_2_ = 0x10;
    auVar12._14_2_ = 0x10;
    auVar12._16_2_ = 0x10;
    auVar12._18_2_ = 0x10;
    auVar12._20_2_ = 0x10;
    auVar12._22_2_ = 0x10;
    auVar12._24_2_ = 0x10;
    auVar12._26_2_ = 0x10;
    auVar12._28_2_ = 0x10;
    auVar12._30_2_ = 0x10;
    do {
      auVar17 = vpaddw_avx2(auVar12,pauVar11[-0xf]);
      auVar14 = vpaddw_avx2(auVar17,auVar14);
      auVar14 = vpsraw_avx2(auVar14,5);
      auVar26 = vpaddw_avx2(auVar12,pauVar11[-0xe]);
      auVar21 = vpaddw_avx2(auVar26,auVar21);
      auVar21 = vpsraw_avx2(auVar21,5);
      auVar21 = vpackuswb_avx2(auVar14,auVar21);
      pauVar8[-3] = auVar21;
      auVar1 = vpaddw_avx2(auVar12,pauVar11[-0xd]);
      auVar21 = vpaddw_avx2(auVar1,auVar15);
      auVar15 = vpsraw_avx2(auVar21,5);
      auVar2 = vpaddw_avx2(auVar12,pauVar11[-0xc]);
      auVar21 = vpaddw_avx2(auVar2,auVar16);
      auVar21 = vpsraw_avx2(auVar21,5);
      auVar21 = vpackuswb_avx2(auVar15,auVar21);
      pauVar8[-2] = auVar21;
      auVar3 = vpaddw_avx2(auVar12,pauVar11[-0xb]);
      auVar21 = vpaddw_avx2(auVar3,auVar22);
      auVar16 = vpsraw_avx2(auVar21,5);
      auVar4 = vpaddw_avx2(auVar12,pauVar11[-10]);
      auVar21 = vpaddw_avx2(auVar4,auVar23);
      auVar21 = vpsraw_avx2(auVar21,5);
      auVar21 = vpackuswb_avx2(auVar16,auVar21);
      pauVar8[-1] = auVar21;
      auVar5 = vpaddw_avx2(auVar12,pauVar11[-9]);
      auVar21 = vpaddw_avx2(auVar5,auVar25);
      auVar6 = vpaddw_avx2(auVar12,pauVar11[-8]);
      auVar16 = vpsraw_avx2(auVar21,5);
      auVar21 = vpaddw_avx2(auVar6,auVar24);
      auVar21 = vpsraw_avx2(auVar21,5);
      auVar21 = vpackuswb_avx2(auVar16,auVar21);
      *pauVar8 = auVar21;
      auVar14 = pauVar11[-7];
      auVar21 = pauVar11[-6];
      auVar16 = vpaddw_avx2(auVar17,auVar14);
      auVar22 = vpsraw_avx2(auVar16,5);
      auVar16 = vpaddw_avx2(auVar26,auVar21);
      auVar16 = vpsraw_avx2(auVar16,5);
      auVar16 = vpackuswb_avx2(auVar22,auVar16);
      *(undefined1 (*) [32])(pauVar8[-3] + lVar9) = auVar16;
      auVar15 = pauVar11[-5];
      auVar16 = pauVar11[-4];
      auVar22 = vpaddw_avx2(auVar1,auVar15);
      auVar23 = vpsraw_avx2(auVar22,5);
      auVar22 = vpaddw_avx2(auVar2,auVar16);
      auVar22 = vpsraw_avx2(auVar22,5);
      auVar22 = vpackuswb_avx2(auVar23,auVar22);
      *(undefined1 (*) [32])(pauVar8[-2] + lVar9) = auVar22;
      auVar22 = pauVar11[-3];
      auVar23 = pauVar11[-2];
      auVar25 = vpaddw_avx2(auVar3,auVar22);
      auVar24 = vpsraw_avx2(auVar25,5);
      auVar25 = vpaddw_avx2(auVar4,auVar23);
      auVar25 = vpsraw_avx2(auVar25,5);
      auVar25 = vpackuswb_avx2(auVar24,auVar25);
      *(undefined1 (*) [32])(pauVar8[-1] + lVar9) = auVar25;
      auVar25 = pauVar11[-1];
      auVar24 = *pauVar11;
      auVar17 = vpaddw_avx2(auVar5,auVar25);
      auVar26 = vpsraw_avx2(auVar17,5);
      auVar17 = vpaddw_avx2(auVar6,auVar24);
      auVar17 = vpsraw_avx2(auVar17,5);
      auVar17 = vpackuswb_avx2(auVar26,auVar17);
      *(undefined1 (*) [32])(*pauVar8 + lVar9) = auVar17;
      pauVar11 = pauVar11 + 0x10;
      pauVar8 = (undefined1 (*) [32])(*pauVar8 + dst_stride * 2);
      uVar7 = (int)dst_00 - 2;
      dst_00 = (uint8_t *)(ulong)uVar7;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_2tap_half_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  (void)filter_params_y;
  (void)subpel_y_q4;

  if (w == 2) {
    __m128i s_32[2];

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)im);

    do {
      const __m128i res = xy_y_convolve_2tap_2x2_half_pel_sse2(im, s_32);
      const __m128i r = xy_y_round_half_pel_sse2(res);
      pack_store_2x2_sse2(r, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 4) {
    __m128i s_64[2];

    s_64[0] = _mm_loadl_epi64((__m128i *)im);

    do {
      const __m128i res = xy_y_convolve_2tap_4x2_half_pel_sse2(im, s_64);
      const __m128i r = xy_y_round_half_pel_sse2(res);
      pack_store_4x2_sse2(r, dst, dst_stride);
      im += 2 * 4;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 8) {
    __m128i s_128[2];

    s_128[0] = _mm_loadu_si128((__m128i *)im);

    do {
      const __m256i res = xy_y_convolve_2tap_8x2_half_pel_avx2(im, s_128);
      const __m256i r = xy_y_round_half_pel_avx2(res);
      pack_store_8x2_avx2(r, dst, dst_stride);
      im += 2 * 8;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 16) {
    __m256i s_256[2], r[2];

    s_256[0] = _mm256_loadu_si256((__m256i *)im);

    do {
      xy_y_convolve_2tap_16x2_half_pel_avx2(im, s_256, r);
      r[0] = xy_y_round_half_pel_avx2(r[0]);
      r[1] = xy_y_round_half_pel_avx2(r[1]);
      xy_y_pack_store_16x2_avx2(r[0], r[1], dst, dst_stride);
      im += 2 * 16;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 32) {
    __m256i s_256[2][2];

    s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
    s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 32, s_256[0], s_256[1], dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 2 * 32, s_256[1], s_256[0],
                                              dst + dst_stride);
      im += 2 * 32;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 64) {
    __m256i s_256[2][4];

    s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
    s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
    s_256[0][2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
    s_256[0][3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 64, s_256[0] + 0,
                                              s_256[1] + 0, dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 96, s_256[0] + 2,
                                              s_256[1] + 2, dst + 32);
      im += 2 * 64;
      xy_y_convolve_2tap_half_pel_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                              dst + dst_stride);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 32, s_256[1] + 2, s_256[0] + 2, dst + dst_stride + 32);
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i s_256[2][8];

    assert(w == 128);

    load_16bit_8rows_avx2(im, 16, s_256[0]);

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 128, s_256[0] + 0,
                                              s_256[1] + 0, dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 160, s_256[0] + 2,
                                              s_256[1] + 2, dst + 1 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 192, s_256[0] + 4,
                                              s_256[1] + 4, dst + 2 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 224, s_256[0] + 6,
                                              s_256[1] + 6, dst + 3 * 32);
      im += 2 * 128;
      xy_y_convolve_2tap_half_pel_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                              dst + dst_stride);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 32, s_256[1] + 2, s_256[0] + 2, dst + dst_stride + 1 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 64, s_256[1] + 4, s_256[0] + 4, dst + dst_stride + 2 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 96, s_256[1] + 6, s_256[0] + 6, dst + dst_stride + 3 * 32);
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  }
}